

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

int STRING_replace(STRING_HANDLE handle,char target,char replace)

{
  size_t sVar1;
  size_t sVar2;
  STRING *str_value;
  int iVar3;
  
  if (handle == (STRING_HANDLE)0x0) {
    iVar3 = 0x367;
  }
  else {
    iVar3 = 0;
    if (target != replace) {
      sVar1 = strlen(handle->s);
      iVar3 = 0;
      if (sVar1 != 0) {
        sVar2 = 0;
        do {
          if (handle->s[sVar2] == target) {
            handle->s[sVar2] = replace;
          }
          sVar2 = sVar2 + 1;
        } while (sVar1 != sVar2);
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int STRING_replace(STRING_HANDLE handle, char target, char replace)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_STRING_07_046: [ If handle is NULL STRING_replace shall return a non-zero value. ] */
        result = MU_FAILURE;
    }
    else if (target == replace)
    {
        /* Codes_SRS_STRING_07_048: [ If target and replace are equal STRING_replace, shall do nothing shall return zero. ] */
        result = 0;
    }
    else
    {
        size_t length;
        size_t index;
        /* Codes_SRS_STRING_07_047: [ STRING_replace shall replace all instances of target with replace. ] */
        STRING* str_value = (STRING*)handle;
        length = strlen(str_value->s);
        for (index = 0; index < length; index++)
        {
            if (str_value->s[index] == target)
            {
                str_value->s[index] = replace;
            }
        }
        /* Codes_SRS_STRING_07_049: [ On success STRING_replace shall return zero. ] */
        result = 0;
    }
    return result;
}